

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O3

ImfHeader * ImfCopyHeader(ImfHeader *hdr)

{
  Header *this;
  
  this = (Header *)operator_new(0x38);
  Imf_3_4::Header::Header(this,(Header *)hdr);
  return (ImfHeader *)this;
}

Assistant:

ImfHeader*
ImfCopyHeader (const ImfHeader* hdr)
{
    try
    {
        return (ImfHeader*) new OPENEXR_IMF_INTERNAL_NAMESPACE::Header (
            *header (hdr));
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}